

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# prototype_factory_test.cpp
# Opt level: O2

int __thiscall
anon_unknown.dwarf_10d2d::DerivedSum::clone
          (DerivedSum *this,__fn *__fn,void *__child_stack,int __flags,void *__arg,...)

{
  undefined8 *puVar1;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *__tmp;
  __allocator_type __a2;
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_40;
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::DerivedSum,_std::allocator<(anonymous_namespace)::DerivedSum>,_(__gnu_cxx::_Lock_policy)2>_>_>
  local_38;
  
  puVar1 = (undefined8 *)operator_new(0x20);
  local_38._M_alloc = &__a2;
  puVar1[1] = 0x100000001;
  *puVar1 = &PTR___Sp_counted_ptr_inplace_00126fc8;
  puVar1[2] = &PTR_clone_00127018;
  *(int *)(puVar1 + 3) = (int)__child_stack;
  local_38._M_ptr = (pointer)0x0;
  std::
  __allocated_ptr<std::allocator<std::_Sp_counted_ptr_inplace<(anonymous_namespace)::DerivedSum,_std::allocator<(anonymous_namespace)::DerivedSum>,_(__gnu_cxx::_Lock_policy)2>_>_>
  ::~__allocated_ptr(&local_38);
  (this->super_BaseMultiParms)._vptr_BaseMultiParms = (_func_int **)(puVar1 + 2);
  local_40._M_pi = (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0;
  *(undefined8 **)&this->m_a = puVar1;
  std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_40);
  return (int)this;
}

Assistant:

BaseMultiParms::clone_type clone(int a) override { return make_shared<DerivedSum>(a); }